

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O2

AssertionResult *
iutest::internal::CmpHelperMemCmpNE<test::spi_test::TestObjectX>
          (AssertionResult *__return_storage_ptr__,char *expected_str,char *actual_str,
          TestObjectX *expected,TestObjectX *actual)

{
  int iVar1;
  AssertionResult *pAVar2;
  char *actual_str_local;
  char *expected_str_local;
  string local_60;
  AssertionResult local_40;
  
  actual_str_local = actual_str;
  expected_str_local = expected_str;
  iVar1 = bcmp(actual,expected,0xc);
  if (iVar1 == 0) {
    local_40.m_message._M_dataplus._M_p = (pointer)&local_40.m_message.field_2;
    local_40.m_message._M_string_length = 0;
    local_40.m_message.field_2._M_local_buf[0] = '\0';
    local_40.m_result = false;
    pAVar2 = AssertionResult::operator<<(&local_40,(char (*) [18])"error: Expected: ");
    pAVar2 = AssertionResult::operator<<(pAVar2,&expected_str_local);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [5])" != ");
    pAVar2 = AssertionResult::operator<<(pAVar2,&actual_str_local);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [12])0x31d64d);
    PrintToString<test::spi_test::TestObjectX>(&local_60,expected);
    pAVar2 = AssertionResult::operator<<(pAVar2,&local_60);
    AssertionResult::AssertionResult(__return_storage_ptr__,pAVar2);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_40);
  }
  else {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_message).field_2;
    (__return_storage_ptr__->m_message)._M_string_length = 0;
    (__return_storage_ptr__->m_message).field_2._M_local_buf[0] = '\0';
    __return_storage_ptr__->m_result = true;
  }
  return __return_storage_ptr__;
}

Assistant:

inline AssertionResult CmpHelperMemCmpNE(const char* expected_str, const char* actual_str
    , const T& expected, const T& actual)
{
IUTEST_PRAGMA_WARN_PUSH()
IUTEST_PRAGMA_WARN_DISABLE_SIGN_COMPARE()

    if IUTEST_COND_LIKELY( memcmp(&actual, &expected, sizeof(T)) != 0 )
    {
        return AssertionSuccess();
    }